

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGenerator.cpp
# Opt level: O0

tuple<SudokuGitter,_SudokuGitter> * __thiscall
SudokuGenerator::generateNewBig
          (tuple<SudokuGitter,_SudokuGitter> *__return_storage_ptr__,SudokuGenerator *this)

{
  uint uVar1;
  uint uVar2;
  SudokuGenerator *pSVar3;
  undefined1 local_a0 [8];
  SudokuGitter linksOben;
  SudokuGenerator *linksObenGen;
  SudokuGitter untenRechts;
  SudokuGenerator *untenRechtsGen;
  SudokuGenerator *this_local;
  
  pSVar3 = (SudokuGenerator *)operator_new(0x48);
  SudokuGenerator(pSVar3,this->elementCount);
  generateNew((SudokuGitter *)&linksObenGen,pSVar3);
  pSVar3 = (SudokuGenerator *)operator_new(0x48);
  SudokuGenerator(pSVar3,this->elementCount);
  uVar1 = SudokuGitter::getQuadHeight(&this->gitter);
  uVar2 = SudokuGitter::getQuadWidth(&this->gitter);
  SudokuGitter::getQuad
            ((vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
              *)&linksOben.quadHeight,(SudokuGitter *)&linksObenGen,uVar1 - 1,uVar2 - 1);
  SudokuGitter::setQuadPermanent
            (&pSVar3->gitter,0,0,
             (vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
              *)&linksOben.quadHeight);
  std::
  vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
  ::~vector((vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
             *)&linksOben.quadHeight);
  generateNewFromRow((SudokuGitter *)local_a0,pSVar3,0);
  std::tuple<SudokuGitter,_SudokuGitter>::tuple<SudokuGitter_&,_SudokuGitter_&,_true>
            (__return_storage_ptr__,(SudokuGitter *)&linksObenGen,(SudokuGitter *)local_a0);
  SudokuGitter::~SudokuGitter((SudokuGitter *)local_a0);
  SudokuGitter::~SudokuGitter((SudokuGitter *)&linksObenGen);
  return __return_storage_ptr__;
}

Assistant:

tuple<SudokuGitter, SudokuGitter> SudokuGenerator::generateNewBig() {
    SudokuGenerator *untenRechtsGen = new SudokuGenerator(elementCount);
    SudokuGitter untenRechts = untenRechtsGen->generateNew();

    SudokuGenerator *linksObenGen = new SudokuGenerator(elementCount);
    linksObenGen->gitter.setQuadPermanent(0, 0,
                                          untenRechts.getQuad(gitter.getQuadHeight() - 1, gitter.getQuadWidth() - 1));
    SudokuGitter linksOben = linksObenGen->generateNewFromRow(0);

    //printCelVecValPtr(untenRechts.getQuad(gitter.getQuadHeight() - 1, gitter.getQuadWidth() - 1), "LinksObenUebernehmen");

    return tuple<SudokuGitter, SudokuGitter>(untenRechts, linksOben);
}